

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateMembers
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_ImmutableMessageFieldLiteGenerator).variables_;
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n     return ($type$) $oneof_name$_;\n  }\n  return $type$.getDefaultInstance();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n  $null_check$  $oneof_name$_ = value;\n  $set_oneof_case_message$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void merge$capitalized_name$($type$ value) {\n  $null_check$  if ($has_oneof_case_message$ &&\n      $oneof_name$_ != $type$.getDefaultInstance()) {\n    $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n        .mergeFrom(value).buildPartial();\n  } else {\n    $oneof_name$_ = value;\n  }\n  $set_oneof_case_message$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "     return ($type$) $oneof_name$_;\n"
                 "  }\n"
                 "  return $type$.getDefaultInstance();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "private void set$capitalized_name$($type$ value) {\n"
                 "  $null_check$"
                 "  $oneof_name$_ = value;\n"
                 "  $set_oneof_case_message$;\n"
                 "}\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(
      variables_,
      "private void merge$capitalized_name$($type$ value) {\n"
      "  $null_check$"
      "  if ($has_oneof_case_message$ &&\n"
      "      $oneof_name$_ != $type$.getDefaultInstance()) {\n"
      "    $oneof_name$_ = $type$.newBuilder(($type$) $oneof_name$_)\n"
      "        .mergeFrom(value).buildPartial();\n"
      "  } else {\n"
      "    $oneof_name$_ = value;\n"
      "  }\n"
      "  $set_oneof_case_message$;\n"
      "}\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    $clear_oneof_case_message$;\n"
                 "    $oneof_name$_ = null;\n"
                 "  }\n"
                 "}\n");
}